

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O2

Abc_Cex_t * Pdr_ManDeriveCex(Pdr_Man_t *p)

{
  Pdr_Obl_t *pPVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Pdr_Obl_t **ppPVar5;
  Abc_Cex_t *p_00;
  Pdr_Set_t *pPVar6;
  uint uVar7;
  long lVar8;
  Pdr_Obl_t **ppPVar9;
  int iVar10;
  
  uVar7 = 0;
  ppPVar9 = &p->pQueue;
  for (ppPVar5 = ppPVar9; *ppPVar5 != (Pdr_Obl_t *)0x0; ppPVar5 = &(*ppPVar5)->pNext) {
    uVar7 = uVar7 - 1;
  }
  p_00 = Abc_CexAlloc(p->pAig->nRegs,p->pAig->nTruePis,-uVar7);
  p_00->iPo = p->iOutCur;
  p_00->iFrame = ~uVar7;
  iVar10 = 0;
  do {
    pPVar1 = *ppPVar9;
    if (pPVar1 == (Pdr_Obl_t *)0x0) {
      if (-uVar7 == iVar10) {
        iVar10 = Saig_ManVerifyCex(p->pAig,p_00);
        if (iVar10 == 0) {
          printf("CEX for output %d is not valid.\n",(ulong)(uint)p->iOutCur);
        }
        return p_00;
      }
      __assert_fail("f == nFrames",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                    ,0x1af,"Abc_Cex_t *Pdr_ManDeriveCex(Pdr_Man_t *)");
    }
    pPVar6 = pPVar1->pState;
    for (lVar8 = (long)pPVar6->nLits; lVar8 < pPVar6->nTotal; lVar8 = lVar8 + 1) {
      iVar4 = *(int *)(&pPVar6->field_0x14 + lVar8 * 4);
      iVar2 = Abc_LitIsCompl(iVar4);
      if (iVar2 == 0) {
        iVar2 = Abc_Lit2Var(iVar4);
        if (iVar2 < p_00->nPis) {
          iVar3 = Abc_Lit2Var(iVar4);
          iVar2 = p_00->nPis;
          if (iVar2 <= iVar3) {
            __assert_fail("Abc_Lit2Var(Lit) < pCex->nPis",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                          ,0x1ac,"Abc_Cex_t *Pdr_ManDeriveCex(Pdr_Man_t *)");
          }
          iVar3 = p_00->nRegs;
          iVar4 = Abc_Lit2Var(iVar4);
          iVar4 = iVar4 + iVar2 * iVar10 + iVar3;
          (&p_00[1].iPo)[iVar4 >> 5] = (&p_00[1].iPo)[iVar4 >> 5] | 1 << ((byte)iVar4 & 0x1f);
        }
      }
      pPVar6 = pPVar1->pState;
    }
    ppPVar9 = &pPVar1->pNext;
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

Abc_Cex_t * Pdr_ManDeriveCex( Pdr_Man_t * p )
{
    Abc_Cex_t * pCex;
    Pdr_Obl_t * pObl;
    int i, f, Lit, nFrames = 0;
    // count the number of frames
    for ( pObl = p->pQueue; pObl; pObl = pObl->pNext )
        nFrames++;
    // create the counter-example
    pCex = Abc_CexAlloc( Aig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), nFrames );
    pCex->iPo    = p->iOutCur;
    pCex->iFrame = nFrames-1;
    for ( pObl = p->pQueue, f = 0; pObl; pObl = pObl->pNext, f++ )
        for ( i = pObl->pState->nLits; i < pObl->pState->nTotal; i++ )
        {
            Lit = pObl->pState->Lits[i];
            if ( Abc_LitIsCompl(Lit) )
                continue;
            if ( Abc_Lit2Var(Lit) >= pCex->nPis ) // allows PPI literals to be thrown away
                continue;
            assert( Abc_Lit2Var(Lit) < pCex->nPis );
            Abc_InfoSetBit( pCex->pData, pCex->nRegs + f * pCex->nPis + Abc_Lit2Var(Lit) );
        }
    assert( f == nFrames );
    if ( !Saig_ManVerifyCex(p->pAig, pCex) )
        printf( "CEX for output %d is not valid.\n", p->iOutCur );
    return pCex;
}